

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

void os_get_tmp_path(char *buf)

{
  int iVar1;
  char *__file;
  size_t sVar2;
  stat inf;
  stat local_a0;
  
  __file = getenv("TMPDIR");
  if ((__file == (char *)0x0) || (*__file == '\0')) {
    __file = "/tmp";
  }
  iVar1 = stat(__file,&local_a0);
  if ((iVar1 == 0) && ((local_a0.st_mode & 0xf000) == 0x4000)) {
    strcpy(buf,__file);
    sVar2 = strlen(buf);
    if (buf[sVar2 - 1] == '/') {
      return;
    }
    buf[sVar2] = '/';
    buf = buf + sVar2 + 1;
  }
  *buf = '\0';
  return;
}

Assistant:

void
os_get_tmp_path( char* buf )
{
    // Try the usual env. variable first.
    const char* tmpDir = getenv("TMPDIR");

    // If no such variable exists, try P_tmpdir (if defined in
    // <stdio.h>).
#ifdef P_tmpdir
    if (tmpDir == 0 or tmpDir[0] == '\0') {
        tmpDir = P_tmpdir;
    }
#endif

    // If we still lack a path, use "/tmp".
    if (tmpDir == 0 or tmpDir[0] == '\0') {
        tmpDir = "/tmp";
    }

    // If the directory doesn't exist or is not a directory, don't
    // provide anything at all (which means that the current
    // directory will be used).
    struct stat inf;
    int statRet = stat(tmpDir, &inf);
    if (statRet != 0 or (inf.st_mode & S_IFMT) != S_IFDIR) {
        buf[0] = '\0';
        return;
    }

    strcpy(buf, tmpDir);

    // Append a slash if necessary.
    size_t len = strlen(buf);
    if (buf[len - 1] != '/') {
        buf[len] = '/';
        buf[len + 1] = '\0';
    }
}